

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  Extension *ext;
  int in_stack_ffffffffffffff94;
  ExtensionSet *in_stack_ffffffffffffff98;
  bool local_1;
  
  pEVar1 = FindOrNull(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  if (pEVar1 == (Extension *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = (bool)((pEVar1->field_0xa & 0xf ^ 0xff) & 1);
  }
  return local_1;
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == NULL) return false;
  GOOGLE_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}